

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Hop_Obj_t * Abc_RecToHop3(Hop_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pIfObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  word *t;
  Hop_Obj_t *pHVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *p_00;
  bool bVar10;
  int local_8c;
  int nLeaves;
  int BestPo;
  int uSupport;
  int i;
  Gia_Obj_t *pGiaTemp;
  Gia_Obj_t *pGiaPo;
  Gia_Man_t *pGia;
  Hop_Obj_t *pHopObj;
  Hop_Obj_t *pFan1;
  Hop_Obj_t *pFan0;
  char local_48 [4];
  uint uCanonPhase;
  char pCanonPerm [16];
  Lms_Man_t *p;
  If_Obj_t *pIfObj_local;
  If_Cut_t *pCut_local;
  If_Man_t *pIfMan_local;
  Hop_Man_t *pMan_local;
  
  pCanonPerm._8_8_ = s_pMan3;
  pFan0._4_4_ = 0;
  pGiaPo = (Gia_Obj_t *)s_pMan3->pGia;
  _uSupport = (Gia_Obj_t *)0x0;
  local_8c = -1;
  iVar2 = If_CutLeaveNum(pCut);
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x410,"Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)"
                 );
  }
  t = If_CutTruthW(pIfMan,pCut);
  nLeaves = Abc_TtSupport(t,iVar2);
  if (nLeaves == 0) {
    pHVar6 = Hop_ManConst0(pMan);
    iVar2 = If_CutTruthIsCompl(pCut);
    pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar6,iVar2);
  }
  else {
    iVar3 = Abc_TtSuppIsMinBase(nLeaves);
    if ((iVar3 == 0) || (nLeaves == 1)) {
      iVar2 = Abc_TtSuppOnlyOne(nLeaves);
      if (iVar2 == 0) {
        __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x418,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      iVar2 = Abc_TtSuppFindFirst(nLeaves);
      pHVar6 = Hop_IthVar(pMan,iVar2);
      iVar2 = If_CutTruthIsCompl(pCut);
      pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar6,iVar2);
    }
    else {
      iVar3 = Gia_WordCountOnes(nLeaves);
      if (iVar3 != iVar2) {
        __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41b,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      If_CutFindBestStruct(pIfMan,pCut,local_48,(uint *)((long)&pFan0 + 4),&local_8c);
      if (local_8c < 0) {
        __assert_fail("BestPo >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41f,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pGiaTemp = Gia_ManCo((Gia_Man_t *)pGiaPo,local_8c);
      if (*(long *)&pGiaPo[0x4b].field_0x4 == 0) {
        pVVar7 = Vec_IntAlloc(0x100);
        *(Vec_Int_t **)&pGiaPo[0x4b].field_0x4 = pVVar7;
      }
      pGVar8 = Gia_ObjFanin0(pGiaTemp);
      iVar3 = Gia_ObjIsAnd(pGVar8);
      pGVar8 = pGiaPo;
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x424,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pGVar9 = Gia_ObjFanin0(pGiaTemp);
      Gia_ObjCollectInternal((Gia_Man_t *)pGVar8,pGVar9);
      iVar3 = Vec_IntSize(*(Vec_Int_t **)&pGiaPo[0x4b].field_0x4);
      if (iVar3 < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x426,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      Vec_PtrClear(*(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60));
      for (BestPo = 0; BestPo < iVar2; BestPo = BestPo + 1) {
        pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
        pHVar6 = Hop_IthVar(pMan,(int)local_48[BestPo]);
        pHVar6 = Hop_NotCond(pHVar6,pFan0._4_4_ >> ((byte)BestPo & 0x1f) & 1);
        Vec_PtrPush(pVVar1,pHVar6);
      }
      BestPo = 0;
      while( true ) {
        iVar3 = BestPo;
        iVar4 = Vec_IntSize(*(Vec_Int_t **)&pGiaPo[0x4b].field_0x4);
        pGVar8 = pGiaPo;
        bVar10 = false;
        if (iVar3 < iVar4) {
          iVar3 = Vec_IntEntry(*(Vec_Int_t **)&pGiaPo[0x4b].field_0x4,BestPo);
          _uSupport = Gia_ManObj((Gia_Man_t *)pGVar8,iVar3);
          bVar10 = _uSupport != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        *(ulong *)_uSupport = *(ulong *)_uSupport & 0xffffffffbfffffff;
        pGVar8 = Gia_ObjFanin0(_uSupport);
        iVar3 = Gia_ObjIsAnd(pGVar8);
        pGVar8 = pGiaPo;
        if (iVar3 == 0) {
          pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
          pGVar8 = Gia_ObjFanin0(_uSupport);
          iVar3 = Gia_ObjCioId(pGVar8);
          pFan1 = (Hop_Obj_t *)Vec_PtrEntry(pVVar1,iVar3);
        }
        else {
          pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
          pGVar9 = Gia_ObjFanin0(_uSupport);
          iVar3 = Gia_ObjNum((Gia_Man_t *)pGVar8,pGVar9);
          pFan1 = (Hop_Obj_t *)Vec_PtrEntry(pVVar1,iVar3 + iVar2);
        }
        pHVar6 = pFan1;
        iVar3 = Gia_ObjFaninC0(_uSupport);
        pFan1 = Hop_NotCond(pHVar6,iVar3);
        pGVar8 = Gia_ObjFanin1(_uSupport);
        iVar3 = Gia_ObjIsAnd(pGVar8);
        pGVar8 = pGiaPo;
        if (iVar3 == 0) {
          pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
          pGVar8 = Gia_ObjFanin1(_uSupport);
          iVar3 = Gia_ObjCioId(pGVar8);
          pHopObj = (Hop_Obj_t *)Vec_PtrEntry(pVVar1,iVar3);
        }
        else {
          pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
          pGVar9 = Gia_ObjFanin1(_uSupport);
          iVar3 = Gia_ObjNum((Gia_Man_t *)pGVar8,pGVar9);
          pHopObj = (Hop_Obj_t *)Vec_PtrEntry(pVVar1,iVar3 + iVar2);
        }
        pHVar6 = pHopObj;
        iVar3 = Gia_ObjFaninC1(_uSupport);
        pHopObj = Hop_NotCond(pHVar6,iVar3);
        pGia = (Gia_Man_t *)Hop_And(pMan,pFan1,pHopObj);
        Vec_PtrPush(*(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60),pGia);
        BestPo = BestPo + 1;
      }
      iVar3 = Gia_ObjIsAnd(_uSupport);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x440,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pVVar1 = *(Vec_Ptr_t **)(pCanonPerm._8_8_ + 0x60);
      iVar3 = Gia_ObjNum((Gia_Man_t *)pGiaPo,_uSupport);
      p_00 = (Gia_Man_t *)Vec_PtrEntry(pVVar1,iVar3 + iVar2);
      pGia = p_00;
      uVar5 = Gia_ObjFaninC0(pGiaTemp);
      pMan_local = (Hop_Man_t *)
                   Hop_NotCond((Hop_Obj_t *)p_00,uVar5 ^ pFan0._4_4_ >> ((byte)iVar2 & 0x1f) & 1);
    }
  }
  return (Hop_Obj_t *)pMan_local;
}

Assistant:

Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    Hop_Obj_t * pFan0, * pFan1, * pHopObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Hop_NotCond( Hop_ManConst0(pMan), If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Hop_NotCond( Hop_IthVar(pMan, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );
    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect HOP nodes for leaves
    Vec_PtrClear( p->vLabelsP );
    for ( i = 0; i < nLeaves; i++ )
        Vec_PtrPush( p->vLabelsP, Hop_NotCond(Hop_IthVar(pMan, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        pFan0 = Hop_NotCond(pFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        pFan1 = Hop_NotCond(pFan1, Gia_ObjFaninC1(pGiaTemp));

        pHopObj = Hop_And(pMan, pFan0, pFan1);
        Vec_PtrPush(p->vLabelsP, pHopObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    pHopObj = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Hop_NotCond( pHopObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) );    
}